

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O0

int * Kit_TruthStatsArray(uint *pArray,int nVars,int nFuncs)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  Vec_Int_t *p;
  Vec_Int_t *vMemory;
  int nInts;
  int *pRes;
  int f;
  int nFuncs_local;
  int nVars_local;
  uint *pArray_local;
  
  piVar3 = (int *)calloc((long)nFuncs,4);
  iVar1 = Abc_TruthWordNum(nVars);
  p = Vec_IntAlloc(0x10000);
  for (pRes._4_4_ = 0; pRes._4_4_ < nFuncs; pRes._4_4_ = pRes._4_4_ + 1) {
    iVar2 = Kit_TruthStats(pArray + pRes._4_4_ * iVar1,nVars,p);
    piVar3[pRes._4_4_] = iVar2;
  }
  Vec_IntFree(p);
  return piVar3;
}

Assistant:

int * Kit_TruthStatsArray( unsigned * pArray, int nVars, int nFuncs )
{
    int f, * pRes = ABC_CALLOC( int, nFuncs );
    int nInts = Abc_TruthWordNum( nVars );
    Vec_Int_t * vMemory = Vec_IntAlloc( 1 << 16 );
    for ( f = 0; f < nFuncs; f++ )
        pRes[f] = Kit_TruthStats( pArray + f*nInts, nVars, vMemory );
    Vec_IntFree( vMemory );
    return pRes;
}